

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool jsonip::parser::semantic_rule<jsonip::grammar::double_,jsonip::parser::number_>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 local_40 [16];
  long local_30;
  
  auVar2 = ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::pos(state);
  bVar1 = seq_<jsonip::parser::opt_<jsonip::parser::char_<(char)45>>,jsonip::parser::positive_,jsonip::parser::opt_<jsonip::parser::seq_<jsonip::parser::dot,jsonip::parser::positive_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>>,jsonip::parser::opt_<jsonip::parser::seq_<jsonip::parser::e_,jsonip::parser::positive_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                    (state);
  if (bVar1) {
    local_30 = ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::pos(state);
    local_30 = local_30 - auVar2._0_8_;
    local_40 = auVar2;
    grammar::double_::
    process_match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>,std::pair<std::fpos<__mbstate_t>,long>>
              (state,(pair<std::fpos<__mbstate_t>,_long> *)local_40);
  }
  return bVar1;
}

Assistant:

static inline bool match(S& state)
        {
            typename S::PositionType p = state.pos();

            // Try the rule itself
            bool result;
            if (true == (result = C0::match(state)))
                A::process_match(state, std::make_pair(p, state.pos() - p));

            return result;
        }